

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

void __thiscall QAbstractSpinBox::contextMenuEvent(QAbstractSpinBox *this,QContextMenuEvent *event)

{
  QAbstractSpinBoxPrivate *this_00;
  long lVar1;
  bool bVar2;
  QMenu *p;
  QAction *this_01;
  QAction *pQVar3;
  QAction *pQVar4;
  QPoint QVar5;
  QAction *pQVar6;
  long lVar7;
  QWidget *pQVar8;
  long in_FS_OFFSET;
  undefined8 uStack_90;
  QPoint local_78;
  QPoint local_70;
  QArrayDataPointer<char16_t> local_68;
  QWeakPointer<QObject> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSpinBoxPrivate **)(this + 8);
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  p = QLineEdit::createStandardContextMenu(this_00->edit);
  QPointer<QMenu>::QPointer<void>((QPointer<QMenu> *)&local_48,p);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)&local_48);
  if (!bVar2) goto LAB_0043fc02;
  QAbstractSpinBoxPrivate::reset(this_00);
  this_01 = (QAction *)operator_new(0x10);
  tr((QString *)&local_68,"&Select All",(char *)0x0,-1);
  pQVar8 = (QWidget *)0x0;
  if ((local_48.d != (Data *)0x0) &&
     (pQVar8 = (QWidget *)local_48.value, *(int *)(local_48.d + 4) == 0)) {
    pQVar8 = (QWidget *)0x0;
  }
  QAction::QAction(this_01,(QString *)&local_68,&pQVar8->super_QObject);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QKeySequence::QKeySequence((QKeySequence *)&local_68,SelectAll);
  QAction::setShortcut((QKeySequence *)this_01);
  QKeySequence::~QKeySequence((QKeySequence *)&local_68);
  if ((local_48.d == (Data *)0x0) ||
     (pQVar8 = (QWidget *)local_48.value, *(int *)(local_48.d + 4) == 0)) {
    pQVar8 = (QWidget *)0x0;
  }
  lVar7 = *(long *)&(this_00->edit->super_QWidget).field_0x8;
  lVar1 = *(long *)(lVar7 + 0x260);
  if ((lVar1 == 0) || (*(int *)(lVar1 + 4) == 0)) {
    pQVar3 = (QAction *)0x0;
  }
  else {
    pQVar3 = *(QAction **)(lVar7 + 0x268);
  }
  QWidget::insertAction(pQVar8,pQVar3,this_01);
  if ((local_48.d == (Data *)0x0) ||
     (pQVar8 = (QWidget *)local_48.value, *(int *)(local_48.d + 4) == 0)) {
    pQVar8 = (QWidget *)0x0;
  }
  lVar7 = *(long *)&(this_00->edit->super_QWidget).field_0x8;
  lVar1 = *(long *)(lVar7 + 0x260);
  if ((lVar1 == 0) || (*(int *)(lVar1 + 4) == 0)) {
    pQVar3 = (QAction *)0x0;
  }
  else {
    pQVar3 = *(QAction **)(lVar7 + 0x268);
  }
  QWidget::removeAction(pQVar8,pQVar3);
  QMenu::addSeparator((QMenu *)local_48.value);
  (**(code **)(*(long *)this + 0x1c8))(this);
  if (local_48.d == (Data *)0x0) {
    pQVar8 = (QWidget *)0x0;
  }
  else {
    pQVar8 = (QWidget *)local_48.value;
    if (*(int *)(local_48.d + 4) == 0) {
      pQVar8 = (QWidget *)0x0;
    }
  }
  tr((QString *)&local_68,"&Step up",(char *)0x0,-1);
  pQVar3 = QWidget::addAction(pQVar8,(QString *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QAction::setEnabled(SUB81(pQVar3,0));
  pQVar8 = (QWidget *)0x0;
  if ((local_48.d != (Data *)0x0) &&
     (pQVar8 = (QWidget *)local_48.value, *(int *)(local_48.d + 4) == 0)) {
    pQVar8 = (QWidget *)0x0;
  }
  tr((QString *)&local_68,"Step &down",(char *)0x0,-1);
  pQVar4 = QWidget::addAction(pQVar8,(QString *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QAction::setEnabled(SUB81(pQVar4,0));
  QMenu::addSeparator((QMenu *)local_48.value);
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QPointer<QAbstractSpinBox>::QPointer<void>
            ((QPointer<QAbstractSpinBox> *)&local_68,(QAbstractSpinBox *)this);
  if (event[0x38] == (QContextMenuEvent)0x0) {
    local_70 = *(QPoint *)(event + 0x30);
  }
  else {
    local_78.xp.m_i = *(int *)(event + 0x28);
    local_78.yp.m_i = 0;
    QVar5 = QWidget::mapToGlobal((QWidget *)this,&local_78);
    lVar7 = *(long *)(this + 0x20);
    local_70.xp.m_i = ((*(int *)(lVar7 + 0x1c) - *(int *)(lVar7 + 0x14)) + 1) / 2 + QVar5.xp.m_i.m_i
    ;
    local_70.yp.m_i = ((*(int *)(lVar7 + 0x20) - *(int *)(lVar7 + 0x18)) + 1) / 2 + QVar5.yp.m_i.m_i
    ;
  }
  pQVar6 = QMenu::exec((QMenu *)local_48.value,&local_70,(QAction *)0x0);
  if (((local_48.d != (Data *)0x0) && (*(int *)(local_48.d + 4) != 0)) &&
     ((QWidget *)local_48.value != (QWidget *)0x0)) {
    (**(code **)(*(long *)local_48.value + 0x20))();
  }
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)&local_68);
  if (pQVar6 != (QAction *)0x0 && bVar2) {
    if (pQVar6 == pQVar3) {
      lVar7 = *(long *)this;
      uStack_90 = 1;
    }
    else {
      if (pQVar6 != pQVar4) {
        if (pQVar6 == this_01) {
          selectAll(this);
        }
        goto LAB_0043fbf2;
      }
      lVar7 = *(long *)this;
      uStack_90 = 0xffffffffffffffff;
    }
    (**(code **)(lVar7 + 0x1b0))(this,uStack_90);
  }
LAB_0043fbf2:
  event[0xc] = (QContextMenuEvent)0x1;
  QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&local_68);
LAB_0043fc02:
  QWeakPointer<QObject>::~QWeakPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractSpinBox::contextMenuEvent(QContextMenuEvent *event)
{
#ifdef Q_OS_WASM
    if (!qstdweb::haveAsyncify()) {
        qDebug() << " Skipping context menu for spinbox since asyncify is off";
        return;
    }
#endif
    Q_D(QAbstractSpinBox);

    QPointer<QMenu> menu = d->edit->createStandardContextMenu();
    if (!menu)
        return;

    d->reset();

    QAction *selAll = new QAction(tr("&Select All"), menu);
#if QT_CONFIG(shortcut)
    selAll->setShortcut(QKeySequence::SelectAll);
#endif
    menu->insertAction(d->edit->d_func()->selectAllAction,
                      selAll);
    menu->removeAction(d->edit->d_func()->selectAllAction);
    menu->addSeparator();
    const uint se = stepEnabled();
    QAction *up = menu->addAction(tr("&Step up"));
    up->setEnabled(se & StepUpEnabled);
    QAction *down = menu->addAction(tr("Step &down"));
    down->setEnabled(se & StepDownEnabled);
    menu->addSeparator();

    const QPointer<QAbstractSpinBox> that = this;
    const QPoint pos = (event->reason() == QContextMenuEvent::Mouse)
        ? event->globalPos() : mapToGlobal(QPoint(event->pos().x(), 0)) + QPoint(width() / 2, height() / 2);
    const QAction *action = menu->exec(pos);
    delete static_cast<QMenu *>(menu);
    if (that && action) {
        if (action == up) {
            stepBy(1);
        } else if (action == down) {
            stepBy(-1);
        } else if (action == selAll) {
            selectAll();
        }
    }
    event->accept();
}